

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode run_all_transfers(GlobalConfig *global,CURLSH *share,CURLcode result)

{
  per_transfer *ppVar1;
  per_transfer *ppVar2;
  undefined8 uVar3;
  long *__ptr;
  CURLcode CVar4;
  uint uVar5;
  int iVar6;
  timediff_t tVar7;
  per_transfer *ppVar8;
  long lVar9;
  time_t tVar10;
  per_transfer **pppVar11;
  long lVar12;
  ulong uVar13;
  GlobalConfig *pGVar14;
  ulong uVar15;
  bool bVar16;
  curltime cVar17;
  curltime newer;
  _Bool retry_1;
  _Bool skipped;
  _Bool retry;
  _Bool added;
  long delay_1;
  _Bool local_a9;
  _Bool local_a8;
  undefined7 uStack_a7;
  CURLcode local_a0;
  _Bool local_9c [4];
  _Bool local_98;
  undefined7 uStack_97;
  uint local_8c;
  GlobalConfig *local_88;
  CURLM *local_80;
  CURLSH *local_78;
  undefined8 local_70;
  int local_68 [2];
  curltime local_60;
  _Bool local_50;
  _Bool local_4f;
  undefined2 local_4e;
  time_t local_48;
  int local_3c;
  time_t local_38;
  
  uVar13 = (ulong)result;
  local_8c = (uint)*(ushort *)&global->field_0x63;
  if (result == CURLE_OK) {
    if ((*(ushort *)&global->field_0x63 & 1) == 0) {
      local_98 = false;
      local_a8 = false;
      CVar4 = create_transfer(global,share,&local_98,&local_a8);
      uVar13 = (ulong)CVar4;
      if (CVar4 == CURLE_OK) {
        if (local_98 == false) {
          errorf(global,"no transfer performed");
          uVar13 = 0x1a;
        }
        else {
          if (transfers != (per_transfer *)0x0) {
            local_a0 = CURLE_OK;
            uVar13 = 0;
            ppVar8 = transfers;
LAB_00115279:
            cVar17 = curlx_now();
            local_38 = cVar17.tv_sec;
            local_3c = cVar17.tv_usec;
            if ((ppVar8->field_0x1d8 & 0x20) != 0) {
LAB_001152c6:
              local_a0 = post_per_transfer(global,ppVar8,(CURLcode)uVar13,local_9c,(long *)&local_88
                                          );
              pGVar14 = local_88;
              if (local_9c[0] == true) goto LAB_001153b4;
              bVar16 = true;
              if (local_a0 < CURLE_SETOPT_OPTION_SYNTAX) {
                if ((0x1080008000004U >> ((ulong)local_a0 & 0x3f) & 1) == 0) {
                  if ((ulong)local_a0 != 0) goto LAB_001153d2;
                  goto LAB_001153dc;
                }
              }
              else {
LAB_001153d2:
                if ((global->field_0x63 & 4) == 0) {
LAB_001153dc:
                  do {
                    CVar4 = create_transfer(global,share,&local_98,&local_a8);
                    bVar16 = CVar4 != CURLE_OK;
                    if (bVar16) {
                      uVar13 = (ulong)CVar4;
                      local_a0 = CVar4;
                      goto LAB_00115315;
                    }
                  } while (local_a8 != false);
                  uVar13 = 0;
                }
              }
LAB_00115315:
              ppVar1 = ppVar8->next;
              ppVar2 = ppVar8->prev;
              pppVar11 = &ppVar2->next;
              if (ppVar2 == (per_transfer *)0x0) {
                pppVar11 = &transfers;
              }
              ((per_transfer *)pppVar11)->next = ppVar1;
              pppVar11 = &ppVar1->prev;
              if (ppVar1 == (per_transfer *)0x0) {
                pppVar11 = &transfersl;
              }
              *pppVar11 = ppVar2;
              free(ppVar8);
              all_pers = all_pers + -1;
              if ((!bVar16) && (ppVar1 != (per_transfer *)0x0)) goto code_r0x00115366;
              goto LAB_001157eb;
            }
            CVar4 = pre_transfer(global,ppVar8);
            if ((CVar4 == CURLE_OK) &&
               ((global->libcurl == (char *)0x0 || (CVar4 = easysrc_perform(), CVar4 == CURLE_OK))))
            {
              uVar5 = curl_easy_perform(ppVar8->curl);
              uVar13 = (ulong)uVar5;
              goto LAB_001152c6;
            }
            uVar13 = (ulong)CVar4;
LAB_001157eb:
            if (local_a0 != CURLE_OK) {
              uVar13 = (ulong)local_a0;
            }
            if ((int)uVar13 != 0) {
              single_transfer_cleanup(global->current);
              goto LAB_0011516c;
            }
          }
          uVar13 = 0;
        }
      }
    }
    else {
      local_70 = 0;
      local_68[0] = 1;
      local_78 = share;
      cVar17 = curlx_now();
      local_60.tv_sec = cVar17.tv_sec;
      local_60.tv_usec = cVar17.tv_usec;
      local_4e = 0;
      local_48 = time((time_t *)0x0);
      local_88 = global;
      local_80 = (CURLM *)curl_multi_init();
      if (local_80 == (CURLM *)0x0) {
        uVar13 = 0x1b;
      }
      else {
        CVar4 = add_parallel_transfers(global,local_80,share,&local_50,&local_4f);
        if (CVar4 == CURLE_OK) {
          if (all_added == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = 0;
            if ((int)local_70 == 0) {
              uVar15 = 0;
              do {
                if (local_68[0] == 0) {
                  if ((local_50 != true) || ((char)local_4e != '\0')) break;
                }
                else if (((char)local_4e == '\x01') && (ppVar8 = transfers, local_4e._1_1_ == '\0'))
                {
                  for (; ppVar8 != (per_transfer *)0x0; ppVar8 = ppVar8->next) {
                    if ((ppVar8->field_0x1d8 & 8) != 0) {
                      ppVar8->field_0x1d8 = ppVar8->field_0x1d8 | 0x10;
                    }
                  }
                  local_4e = 0x101;
                }
                iVar6 = curl_multi_poll(local_80,0,0,1000,0);
                local_70 = CONCAT44(local_70._4_4_,iVar6);
                if (iVar6 != 0) break;
                iVar6 = curl_multi_perform(local_80,local_68);
                pGVar14 = local_88;
                local_70 = CONCAT44(local_70._4_4_,iVar6);
                if (iVar6 != 0) break;
                progress_meter(local_88,&local_60,false);
                lVar9 = curl_multi_info_read();
                uVar15 = 0;
                if (lVar9 == 0) {
                  if ((char)local_4e == '\0') {
                    uVar15 = 0;
                    tVar10 = time((time_t *)0x0);
                    if (local_48 != tVar10) {
                      uVar15 = 0;
                      local_48 = tVar10;
                      goto LAB_0011577b;
                    }
                  }
                }
                else {
                  do {
                    uVar3 = *(undefined8 *)(lVar9 + 8);
                    CVar4 = *(CURLcode *)(lVar9 + 0x10);
                    curl_easy_getinfo(uVar3,0x100015,&local_a8);
                    curl_multi_remove_handle(local_80,uVar3);
                    ppVar8 = (per_transfer *)CONCAT71(uStack_a7,local_a8);
                    if ((((ppVar8->field_0x1d8 & 0x10) != 0) && (CVar4 == CURLE_ABORTED_BY_CALLBACK)
                        ) && (ppVar8->errorbuffer != (char *)0x0)) {
                      curl_msnprintf(ppVar8->errorbuffer,0x100,
                                     "Transfer aborted due to critical error in another transfer");
                      ppVar8 = (per_transfer *)CONCAT71(uStack_a7,local_a8);
                    }
                    CVar4 = post_per_transfer(pGVar14,ppVar8,CVar4,&local_a9,(long *)&local_98);
                    progress_finalize((per_transfer *)CONCAT71(uStack_a7,local_a8));
                    all_added = all_added + -1;
                    if (local_a9 == true) {
                      lVar9 = CONCAT71(uStack_a7,local_a8);
                      *(byte *)(lVar9 + 0x1d8) = *(byte *)(lVar9 + 0x1d8) & 0xf7;
                      lVar12 = CONCAT71(uStack_97,local_98);
                      if (lVar12 == 0) {
                        lVar12 = 0;
                      }
                      else {
                        tVar10 = time((time_t *)0x0);
                        lVar12 = lVar12 / 1000 + tVar10;
                        lVar9 = CONCAT71(uStack_a7,local_a8);
                      }
                      *(long *)(lVar9 + 0x188) = lVar12;
                    }
                    else {
                      if (CVar4 != CURLE_OK) {
                        if ((int)uVar15 == 0) {
                          uVar15 = (ulong)CVar4;
                        }
                        if ((*(byte *)(CONCAT71(uStack_a7,local_a8) + 0x1d8) & 0x10) == 0) {
                          uVar15 = (ulong)CVar4;
                        }
                      }
                      if ((uint)uVar15 < 0x31) {
                        if ((0x1080008000004U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_001156d5;
                        if (uVar15 != 0) goto LAB_00115743;
                      }
                      else {
LAB_00115743:
                        if ((pGVar14->field_0x63 & 4) != 0) {
LAB_001156d5:
                          local_4e = CONCAT11(local_4e._1_1_,1);
                        }
                      }
                      __ptr = (long *)CONCAT71(uStack_a7,local_a8);
                      ppVar8 = (per_transfer *)*__ptr;
                      ppVar1 = (per_transfer *)__ptr[1];
                      pppVar11 = (per_transfer **)ppVar1;
                      if (ppVar1 == (per_transfer *)0x0) {
                        pppVar11 = &transfers;
                      }
                      ((per_transfer *)pppVar11)->next = ppVar8;
                      pppVar11 = &ppVar8->prev;
                      if (ppVar8 == (per_transfer *)0x0) {
                        pppVar11 = &transfersl;
                      }
                      *pppVar11 = ppVar1;
                      free(__ptr);
                      all_pers = all_pers + -1;
                    }
                    lVar9 = curl_multi_info_read(local_80);
                  } while (lVar9 != 0);
                  if ((char)local_4e == '\0') {
LAB_0011577b:
                    CVar4 = add_parallel_transfers(pGVar14,local_80,local_78,&local_50,&local_4f);
                    if (CVar4 != CURLE_OK) {
                      uVar15 = (ulong)CVar4;
                    }
                    if (local_4f == true) {
                      local_68[0] = 1;
                    }
                    if ((uint)uVar15 < 0x31) {
                      if ((0x1080008000004U >> (uVar15 & 0x3f) & 1) == 0) {
                        if (uVar15 == 0) goto LAB_001157ca;
                        goto LAB_001157df;
                      }
                    }
                    else {
LAB_001157df:
                      if ((pGVar14->field_0x63 & 4) == 0) goto LAB_001157ca;
                    }
                    local_4e = CONCAT11(local_4e._1_1_,1);
                  }
                }
LAB_001157ca:
              } while ((int)local_70 == 0);
            }
            progress_meter(global,&local_60,true);
          }
          uVar13 = (ulong)((uint)((int)local_70 != 3) * 0x10 + 0x1b);
          if ((int)local_70 == 0) {
            uVar13 = uVar15;
          }
        }
        else {
          uVar13 = (ulong)CVar4;
        }
        curl_multi_cleanup(local_80);
      }
    }
  }
LAB_0011516c:
  CVar4 = (CURLcode)uVar13;
  ppVar8 = transfers;
  while (ppVar8 != (per_transfer *)0x0) {
    CVar4 = post_per_transfer(global,ppVar8,(CURLcode)uVar13,&local_98,(long *)&local_88);
    if ((CURLcode)uVar13 == CURLE_OK) {
      uVar13 = (ulong)CVar4;
    }
    CVar4 = (CURLcode)uVar13;
    clean_getout(ppVar8->config);
    ppVar1 = ppVar8->next;
    ppVar2 = ppVar8->prev;
    pppVar11 = &ppVar2->next;
    if (ppVar2 == (per_transfer *)0x0) {
      pppVar11 = &transfers;
    }
    ((per_transfer *)pppVar11)->next = ppVar1;
    pppVar11 = &ppVar1->prev;
    if (ppVar1 == (per_transfer *)0x0) {
      pppVar11 = &transfersl;
    }
    *pppVar11 = ppVar2;
    free(ppVar8);
    all_pers = all_pers + -1;
    ppVar8 = ppVar1;
  }
  *(ushort *)&global->field_0x63 = (ushort)local_8c & 0x600 | *(ushort *)&global->field_0x63 & 63999
  ;
  return CVar4;
code_r0x00115366:
  ppVar8 = ppVar1;
  if (global->ms_per_transfer != 0) {
    cVar17 = curlx_now();
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar17._0_12_,0);
    newer.tv_usec = SUB124(cVar17._0_12_,8);
    cVar17.tv_usec = local_3c;
    cVar17.tv_sec = local_38;
    cVar17._12_4_ = 0;
    tVar7 = curlx_timediff(newer,cVar17);
    if (tVar7 < global->ms_per_transfer) {
      notef(global,"Transfer took %ld ms, waits %ldms as set by --rate",tVar7);
      pGVar14 = (GlobalConfig *)(global->ms_per_transfer - tVar7);
LAB_001153b4:
      tool_go_sleep((long)pGVar14);
    }
  }
  goto LAB_00115279;
}

Assistant:

static CURLcode run_all_transfers(struct GlobalConfig *global,
                                  CURLSH *share,
                                  CURLcode result)
{
  /* Save the values of noprogress and isatty to restore them later on */
  bool orig_noprogress = global->noprogress;
  bool orig_isatty = global->isatty;
  struct per_transfer *per;

  /* Time to actually do the transfers */
  if(!result) {
    if(global->parallel)
      result = parallel_transfers(global, share);
    else
      result = serial_transfers(global, share);
  }

  /* cleanup if there are any left */
  for(per = transfers; per;) {
    bool retry;
    long delay;
    CURLcode result2 = post_per_transfer(global, per, result, &retry, &delay);
    if(!result)
      /* do not overwrite the original error */
      result = result2;

    /* Free list of given URLs */
    clean_getout(per->config);

    per = del_per_transfer(per);
  }

  /* Reset the global config variables */
  global->noprogress = orig_noprogress;
  global->isatty = orig_isatty;


  return result;
}